

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

int VP8LDecodeHeader(VP8LDecoder *dec,VP8Io *io)

{
  int iVar1;
  VP8LBitReader *in_RSI;
  undefined4 *in_RDI;
  int has_alpha;
  int height;
  int width;
  VP8LDecoder *in_stack_00000020;
  int in_stack_0000002c;
  int in_stack_00000030;
  int in_stack_00000034;
  int *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  if (in_RDI != (undefined4 *)0x0) {
    if (in_RSI == (VP8LBitReader *)0x0) {
      *in_RDI = 2;
    }
    else {
      *(VP8LBitReader **)(in_RDI + 2) = in_RSI;
      *in_RDI = 0;
      VP8LInitBitReader((VP8LBitReader *)(in_RDI + 10),(uint8_t *)in_RSI[2].pos_,in_RSI[2].len_);
      iVar1 = ReadImageInfo(in_RSI,(int *)CONCAT44(in_stack_ffffffffffffffe4,
                                                   in_stack_ffffffffffffffe0),
                            in_stack_ffffffffffffffd8,(int *)0x1247b9);
      if (iVar1 == 0) {
        *in_RDI = 3;
      }
      else {
        in_RDI[1] = 2;
        *(undefined4 *)&in_RSI->val_ = in_stack_ffffffffffffffe4;
        *(undefined4 *)((long)&in_RSI->val_ + 4) = in_stack_ffffffffffffffe0;
        iVar1 = DecodeImageStream(in_stack_00000034,in_stack_00000030,in_stack_0000002c,
                                  in_stack_00000020,(uint32_t **)dec);
        if (iVar1 != 0) {
          return 1;
        }
      }
      VP8LClear((VP8LDecoder *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    }
  }
  return 0;
}

Assistant:

int VP8LDecodeHeader(VP8LDecoder* const dec, VP8Io* const io) {
  int width, height, has_alpha;

  if (dec == NULL) return 0;
  if (io == NULL) {
    dec->status_ = VP8_STATUS_INVALID_PARAM;
    return 0;
  }

  dec->io_ = io;
  dec->status_ = VP8_STATUS_OK;
  VP8LInitBitReader(&dec->br_, io->data, io->data_size);
  if (!ReadImageInfo(&dec->br_, &width, &height, &has_alpha)) {
    dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
    goto Error;
  }
  dec->state_ = READ_DIM;
  io->width = width;
  io->height = height;

  if (!DecodeImageStream(width, height, 1, dec, NULL)) goto Error;
  return 1;

 Error:
  VP8LClear(dec);
  assert(dec->status_ != VP8_STATUS_OK);
  return 0;
}